

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::UnifiedCache::get<icu_63::CollationCacheEntry>
          (UnifiedCache *this,CacheKey<icu_63::CollationCacheEntry> *key,void *creationContext,
          CollationCacheEntry **ptr,UErrorCode *status)

{
  UErrorCode creationStatus;
  CollationCacheEntry *tvalue;
  SharedObject *value;
  UErrorCode local_34;
  CollationCacheEntry *local_30;
  CollationCacheEntry *local_28;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  local_34 = U_ZERO_ERROR;
  local_28 = (CollationCacheEntry *)0x0;
  _get(this,&key->super_CacheKeyBase,(SharedObject **)&local_28,creationContext,&local_34);
  local_30 = local_28;
  if (local_34 < U_ILLEGAL_ARGUMENT_ERROR) {
    SharedObject::copyPtr<icu_63::CollationCacheEntry>(local_28,ptr);
  }
  SharedObject::clearPtr<icu_63::CollationCacheEntry>(&local_30);
  if (*status == U_ZERO_ERROR || U_ZERO_ERROR < local_34) {
    *status = local_34;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }